

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueArrayCase::test(UniformValueArrayCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  TestContext *pTVar1;
  deUint32 dVar2;
  GLint GVar3;
  long lVar4;
  undefined8 *puVar5;
  float *pfVar6;
  byte bVar7;
  allocator<char> local_20a;
  allocator<char> local_209;
  float uniformValue [20];
  ShaderProgram program;
  string local_60;
  string local_40;
  
  bVar7 = 0;
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "uniform highp float arrayUniform[5];uniform highp vec2 array2Uniform[5];uniform highp vec3 array3Uniform[5];uniform highp vec4 array4Uniform[5];void main (void)\n{\n\tgl_Position = \n\t\t+ vec4(arrayUniform[0]\t\t+ arrayUniform[1]\t\t+ arrayUniform[2]\t\t+ arrayUniform[3]\t\t+ arrayUniform[4])\n\t\t+ vec4(array2Uniform[0].x\t+ array2Uniform[1].x\t+ array2Uniform[2].x\t+ array2Uniform[3].x\t+ array2Uniform[4].x)\n\t\t+ vec4(array3Uniform[0].x\t+ array3Uniform[1].x\t+ array3Uniform[2].x\t+ array3Uniform[3].x\t+ array3Uniform[4].x)\n\t\t+ vec4(array4Uniform[0].x\t+ array4Uniform[1].x\t+ array4Uniform[2].x\t+ array4Uniform[3].x\t+ array4Uniform[4].x);\n}\n"
             ,&local_209);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n",&local_20a)
  ;
  glu::makeVtxFragSources((ProgramSources *)uniformValue,&local_40,&local_60);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)uniformValue);
  glu::ProgramSources::~ProgramSources((ProgramSources *)uniformValue);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&program);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    puVar5 = &DAT_01825780;
    pfVar6 = uniformValue;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pfVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      pfVar6 = pfVar6 + (ulong)bVar7 * -4 + 2;
    }
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"arrayUniform");
    glu::CallLogWrapper::glUniform1fv(this_00,GVar3,5,uniformValue);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"arrayUniform[0]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,uniformValue[0]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"arrayUniform[1]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,uniformValue[1]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"arrayUniform[2]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,uniformValue[2]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"arrayUniform[3]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,uniformValue[3]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"arrayUniform[4]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,uniformValue[4]);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array2Uniform");
    glu::CallLogWrapper::glUniform2fv(this_00,GVar3,5,uniformValue);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array2Uniform[0]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,uniformValue[0],uniformValue[1]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array2Uniform[1]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,uniformValue[2],uniformValue[3]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array2Uniform[2]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,uniformValue[4],uniformValue[5]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array2Uniform[3]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,uniformValue[6],uniformValue[7]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array2Uniform[4]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,uniformValue[8],uniformValue[9]);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array3Uniform");
    glu::CallLogWrapper::glUniform3fv(this_00,GVar3,5,uniformValue);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array3Uniform[0]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,uniformValue[0],uniformValue[1],uniformValue[2])
    ;
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array3Uniform[1]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,uniformValue[3],uniformValue[4],uniformValue[5])
    ;
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array3Uniform[2]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,uniformValue[6],uniformValue[7],uniformValue[8])
    ;
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array3Uniform[3]");
    verifyUniformValue3f
              (pTVar1,this_00,dVar2,GVar3,uniformValue[9],uniformValue[10],uniformValue[0xb]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array3Uniform[4]");
    verifyUniformValue3f
              (pTVar1,this_00,dVar2,GVar3,uniformValue[0xc],uniformValue[0xd],uniformValue[0xe]);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array4Uniform");
    glu::CallLogWrapper::glUniform4fv(this_00,GVar3,5,uniformValue);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array4Uniform[0]");
    verifyUniformValue4f
              (pTVar1,this_00,dVar2,GVar3,uniformValue[0],uniformValue[1],uniformValue[2],
               uniformValue[3]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array4Uniform[1]");
    verifyUniformValue4f
              (pTVar1,this_00,dVar2,GVar3,uniformValue[4],uniformValue[5],uniformValue[6],
               uniformValue[7]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array4Uniform[2]");
    verifyUniformValue4f
              (pTVar1,this_00,dVar2,GVar3,uniformValue[8],uniformValue[9],uniformValue[10],
               uniformValue[0xb]);
    dVar2 = program.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array4Uniform[3]");
    verifyUniformValue4f
              (pTVar1,this_00,dVar2,GVar3,uniformValue[0xc],uniformValue[0xd],uniformValue[0xe],
               uniformValue[0xf]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"array4Uniform[4]");
    verifyUniformValue4f
              (pTVar1,this_00,program.m_program.m_program,GVar3,uniformValue[0x10],
               uniformValue[0x11],uniformValue[0x12],uniformValue[0x13]);
    ApiCase::expectError(&this->super_ApiCase,0);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp float arrayUniform[5];"
			"uniform highp vec2 array2Uniform[5];"
			"uniform highp vec3 array3Uniform[5];"
			"uniform highp vec4 array4Uniform[5];"
			"void main (void)\n"
			"{\n"
			"	gl_Position = \n"
			"		+ vec4(arrayUniform[0]		+ arrayUniform[1]		+ arrayUniform[2]		+ arrayUniform[3]		+ arrayUniform[4])\n"
			"		+ vec4(array2Uniform[0].x	+ array2Uniform[1].x	+ array2Uniform[2].x	+ array2Uniform[3].x	+ array2Uniform[4].x)\n"
			"		+ vec4(array3Uniform[0].x	+ array3Uniform[1].x	+ array3Uniform[2].x	+ array3Uniform[3].x	+ array3Uniform[4].x)\n"
			"		+ vec4(array4Uniform[0].x	+ array4Uniform[1].x	+ array4Uniform[2].x	+ array4Uniform[3].x	+ array4Uniform[4].x);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		float uniformValue[5 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
			95.0f,	77.0f,	32.0f,	48.0f
		};

		location = glGetUniformLocation(program.getProgram(), "arrayUniform");
		glUniform1fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[0]"), uniformValue[0]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[1]"), uniformValue[1]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[2]"), uniformValue[2]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[3]"), uniformValue[3]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[4]"), uniformValue[4]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array2Uniform");
		glUniform2fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[0]"), uniformValue[2 * 0], uniformValue[(2 * 0) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[1]"), uniformValue[2 * 1], uniformValue[(2 * 1) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[2]"), uniformValue[2 * 2], uniformValue[(2 * 2) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[3]"), uniformValue[2 * 3], uniformValue[(2 * 3) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[4]"), uniformValue[2 * 4], uniformValue[(2 * 4) + 1]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array3Uniform");
		glUniform3fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[0]"), uniformValue[3 * 0], uniformValue[(3 * 0) + 1], uniformValue[(3 * 0) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[1]"), uniformValue[3 * 1], uniformValue[(3 * 1) + 1], uniformValue[(3 * 1) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[2]"), uniformValue[3 * 2], uniformValue[(3 * 2) + 1], uniformValue[(3 * 2) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[3]"), uniformValue[3 * 3], uniformValue[(3 * 3) + 1], uniformValue[(3 * 3) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[4]"), uniformValue[3 * 4], uniformValue[(3 * 4) + 1], uniformValue[(3 * 4) + 2]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array4Uniform");
		glUniform4fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[0]"), uniformValue[4 * 0], uniformValue[(4 * 0) + 1], uniformValue[(4 * 0) + 2], uniformValue[(4 * 0) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[1]"), uniformValue[4 * 1], uniformValue[(4 * 1) + 1], uniformValue[(4 * 1) + 2], uniformValue[(4 * 1) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[2]"), uniformValue[4 * 2], uniformValue[(4 * 2) + 1], uniformValue[(4 * 2) + 2], uniformValue[(4 * 2) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[3]"), uniformValue[4 * 3], uniformValue[(4 * 3) + 1], uniformValue[(4 * 3) + 2], uniformValue[(4 * 3) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[4]"), uniformValue[4 * 4], uniformValue[(4 * 4) + 1], uniformValue[(4 * 4) + 2], uniformValue[(4 * 4) + 3]);
		expectError(GL_NO_ERROR);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}